

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

void at_your_feet(char *str)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *local_38;
  char *local_10;
  char *str_local;
  
  local_10 = str;
  if (((u.uprops[0x1e].intrinsic != 0) ||
      (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
     ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
    local_10 = "Something";
  }
  if ((u._1052_1_ & 1) == 0) {
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      local_38 = vtense(local_10,"appear");
    }
    else {
      local_38 = "lands";
    }
    bVar4 = true;
    if ((u.uprops[0x12].intrinsic == 0) && (bVar4 = true, u.uprops[0x12].extrinsic == 0)) {
      bVar4 = (youmonst.data)->mlet == '\x05';
    }
    pcVar1 = "at";
    if (bVar4) {
      pcVar1 = "beneath";
    }
    pcVar2 = body_part(5);
    pcVar2 = makeplural(pcVar2);
    pline("%s %s %s your %s!",local_10,local_38,pcVar1,pcVar2);
  }
  else {
    pcVar1 = vtense(local_10,"drop");
    pcVar2 = mon_nam(u.ustuck);
    pcVar2 = s_suffix(pcVar2);
    pcVar3 = mbodypart(u.ustuck,0x12);
    pline("%s %s into %s %s.",local_10,pcVar1,pcVar2,pcVar3);
  }
  return;
}

Assistant:

static void at_your_feet(const char *str)
{
	if (Blind) str = "Something";
	if (u.uswallow) {
	    /* barrier between you and the floor */
	    pline("%s %s into %s %s.", str, vtense(str, "drop"),
		  s_suffix(mon_nam(u.ustuck)), mbodypart(u.ustuck, STOMACH));
	} else {
	    pline("%s %s %s your %s!", str,
		  Blind ? "lands" : vtense(str, "appear"),
		  Levitation ? "beneath" : "at",
		  makeplural(body_part(FOOT)));
	}
}